

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeIfElse(ExpressionContext *ctx,SynIfElse *syntax)

{
  ScopeData *scopeData;
  bool bVar1;
  ExprBase *pEVar2;
  uint uVar3;
  int iVar4;
  TypeBase *pTVar5;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  SynBase *pSVar8;
  FunctionData *onwerFunction;
  ExprBase *pEVar9;
  ExprBlock *pEVar10;
  undefined4 extraout_var_01;
  SynBlock *syntax_00;
  ExpressionContext *this;
  IntrusiveList<ExprBase> expressions;
  undefined4 extraout_var_00;
  
  pSVar8 = syntax->condition;
  if ((pSVar8 == (SynBase *)0x0) || (pSVar8->typeID != 0x34)) {
    pEVar7 = AnalyzeExpression(ctx,pSVar8);
    bVar1 = true;
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    uVar3 = IntrusiveList<SynVariableDefinition>::size
                      ((IntrusiveList<SynVariableDefinition> *)&pSVar8[1].begin);
    if (uVar3 != 1) {
      __assert_fail("definitions->definitions.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x2b7f,"ExprBase *AnalyzeIfElse(ExpressionContext &, SynIfElse *)");
    }
    pEVar7 = (ExprBase *)0x0;
    pTVar5 = AnalyzeType(ctx,*(SynBase **)&pSVar8[1].typeID,true,(bool *)0x0);
    pEVar6 = AnalyzeVariableDefinition(ctx,(SynVariableDefinition *)pSVar8[1].begin,0,pTVar5);
    if (pEVar6 == (ExprBase *)0x0) {
      bVar1 = false;
    }
    else if (pEVar6->typeID == 0x1e) {
      bVar1 = false;
      pEVar7 = CreateVariableAccess
                         (ctx,&syntax->super_SynBase,(VariableData *)pEVar6[1]._vptr_ExprBase[1],
                          false);
      pEVar7 = CreateSequence(ctx,&syntax->super_SynBase,pEVar6,pEVar7);
    }
    else {
      bVar1 = false;
      pEVar7 = pEVar6;
    }
  }
  if ((syntax->super_SynBase).field_0x3a != '\x01') {
LAB_001735bf:
    pEVar7 = CreateConditionCast(ctx,pEVar7->source,pEVar7);
    pEVar6 = AnalyzeStatement(ctx,syntax->trueBlock);
    if (!bVar1) {
      expressions.head = (ExprBase *)0x0;
      expressions.tail = (ExprBase *)0x0;
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar6);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar2 = expressions.tail;
      pEVar9 = expressions.head;
      pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
      pTVar5 = ctx->typeVoid;
      this = ctx;
      pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      scopeData = ctx->scope;
      onwerFunction = ExpressionContext::GetCurrentFunction(this,scopeData);
      pSVar8 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar8,onwerFunction,scopeData);
      pEVar6->typeID = 0x36;
      pEVar6->source = &syntax->super_SynBase;
      pEVar6->type = pTVar5;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
      pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar9;
      *(ExprBase **)&pEVar6[1].typeID = pEVar2;
      pEVar6[1].source = pSVar8;
      ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT);
    }
    if (syntax->falseBlock == (SynBase *)0x0) {
      pSVar8 = (SynBase *)0x0;
    }
    else {
      pSVar8 = (SynBase *)AnalyzeStatement(ctx,syntax->falseBlock);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
    pTVar5 = ctx->typeVoid;
    pEVar9->typeID = 0x2f;
    pEVar9->source = &syntax->super_SynBase;
    pEVar9->type = pTVar5;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00241298;
    pEVar9[1]._vptr_ExprBase = (_func_int **)pEVar7;
    *(ExprBase **)&pEVar9[1].typeID = pEVar6;
    pEVar9[1].source = pSVar8;
    return pEVar9;
  }
  if ((pEVar7->type != (TypeBase *)0x0) && (pEVar7->type->typeID == 0)) {
LAB_00173748:
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar5 = ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar5;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
    return pEVar7;
  }
  pEVar7 = CreateConditionCast(ctx,pEVar7->source,pEVar7);
  pEVar6 = CreateCast(ctx,&syntax->super_SynBase,pEVar7,ctx->typeBool,false);
  pEVar6 = anon_unknown.dwarf_b837c::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar6);
  if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 3)) {
    anon_unknown.dwarf_b837c::Report
              (ctx,&syntax->super_SynBase,"ERROR: couldn\'t evaluate condition at compilation time")
    ;
    goto LAB_001735bf;
  }
  if (pEVar6->field_0x29 == '\x01') {
    syntax_00 = (SynBlock *)syntax->trueBlock;
    if (syntax_00 == (SynBlock *)0x0) goto LAB_00173786;
  }
  else {
    syntax_00 = (SynBlock *)syntax->falseBlock;
    if (syntax_00 == (SynBlock *)0x0) goto LAB_00173748;
  }
  if ((syntax_00->super_SynBase).typeID == 0x26) {
    pEVar10 = AnalyzeBlock(ctx,syntax_00,false);
    return &pEVar10->super_ExprBase;
  }
LAB_00173786:
  pEVar7 = AnalyzeStatement(ctx,&syntax_00->super_SynBase);
  return pEVar7;
}

Assistant:

ExprBase* AnalyzeIfElse(ExpressionContext &ctx, SynIfElse *syntax)
{
	SynVariableDefinitions *definitions = getType<SynVariableDefinitions>(syntax->condition);

	ExprBase *condition = NULL;

	if(definitions)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		assert(definitions->definitions.size() == 1);

		TypeBase *type = AnalyzeType(ctx, definitions->type);

		ExprBase *definition = AnalyzeVariableDefinition(ctx, definitions->definitions.head, 0, type);

		if(ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition))
			condition = CreateSequence(ctx, syntax, definition, CreateVariableAccess(ctx, syntax, variableDefinition->variable->variable, false));
		else
			condition = definition;
	}
	else
	{
		condition = AnalyzeExpression(ctx, syntax->condition);
	}

	if(syntax->staticIf)
	{
		if(isType<TypeError>(condition->type))
			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

		condition = CreateConditionCast(ctx, condition->source, condition);

		if(ExprBoolLiteral *number = getType<ExprBoolLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, condition, ctx.typeBool, false))))
		{
			if(number->value)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->trueBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->trueBlock);
			}
			else if(syntax->falseBlock)
			{
				if(SynBlock *node = getType<SynBlock>(syntax->falseBlock))
					return AnalyzeBlock(ctx, node, false);
				else
					return AnalyzeStatement(ctx, syntax->falseBlock);
			}

			return new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
		}

		Report(ctx, syntax, "ERROR: couldn't evaluate condition at compilation time");
	}

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);

	if(definitions)
	{
		IntrusiveList<ExprBase> expressions;

		expressions.push_back(trueBlock);

		trueBlock = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);
	}

	ExprBase *falseBlock = syntax->falseBlock ? AnalyzeStatement(ctx, syntax->falseBlock) : NULL;

	return new (ctx.get<ExprIfElse>()) ExprIfElse(syntax, ctx.typeVoid, condition, trueBlock, falseBlock);
}